

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O3

void __thiscall dynamicgraph::OutStringStream::OutStringStream(OutStringStream *this)

{
  std::ios_base::ios_base
            ((ios_base *)
             &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
              field_0xb0);
  *(code **)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
             field_0xb0 = dynamicgraph::ExceptionSignal::ExceptionSignal;
  *(undefined8 *)&this->field_0x188 = 0;
  *(undefined2 *)&this->field_0x190 = 0;
  *(undefined8 *)&this->field_0x198 = 0;
  *(undefined8 *)&this->field_0x1a0 = 0;
  *(undefined8 *)&this->field_0x1a8 = 0;
  *(undefined8 *)&this->field_0x1b0 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
       = (_func_int **)0x112528;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0 =
       0x112550;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x70 = 0;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x78 = 0;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x79 = 0;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x81 = 0;
  *(undefined1 **)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x90 =
       &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xa0;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x98 = 0;
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xa0 = 0;
  return;
}

Assistant:

OutStringStream::OutStringStream()
    : std::ostringstream(), buffer(0), index(0), bufferSize(0), full(false) {
  dgDEBUGINOUT(15);
}